

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

void TestConstExpr::ConstCastTestT<short>(void)

{
  SafeInt<short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  int iVar2;
  short local_a;
  
  if (ConstCastTestT<short>()::b == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::b);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<short>();
      ConstCastTestT<short>::b = SVar1.m_int != 0;
      __cxa_guard_release(&ConstCastTestT<short>()::b);
    }
  }
  if (ConstCastTestT<short>()::w == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::w);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<short>();
      ConstCastTestT<short>::w = (wchar_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<short>()::w);
    }
  }
  if (ConstCastTestT<short>()::c == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::c);
    if (iVar2 != 0) {
      local_a = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::c = SafeInt::operator_cast_to_char((SafeInt *)&local_a);
      __cxa_guard_release(&ConstCastTestT<short>()::c);
    }
  }
  if (ConstCastTestT<short>()::sc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::sc);
    if (iVar2 != 0) {
      local_a = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::sc = SafeInt::operator_cast_to_signed_char((SafeInt *)&local_a);
      __cxa_guard_release(&ConstCastTestT<short>()::sc);
    }
  }
  if (ConstCastTestT<short>()::uc == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::uc);
    if (iVar2 != 0) {
      local_a = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::uc = SafeInt::operator_cast_to_unsigned_char((SafeInt *)&local_a);
      __cxa_guard_release(&ConstCastTestT<short>()::uc);
    }
  }
  if (ConstCastTestT<short>()::s == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::s);
    if (iVar2 != 0) {
      ConstCastTestT<short>::s = (short)ConstSafeInt<short>();
      __cxa_guard_release(&ConstCastTestT<short>()::s);
    }
  }
  if (ConstCastTestT<short>()::us == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::us);
    if (iVar2 != 0) {
      local_a = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::us = SafeInt::operator_cast_to_unsigned_short((SafeInt *)&local_a);
      __cxa_guard_release(&ConstCastTestT<short>()::us);
    }
  }
  if (ConstCastTestT<short>()::i == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::i);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<short>();
      ConstCastTestT<short>::i = (int)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<short>()::i);
    }
  }
  if (ConstCastTestT<short>()::ui == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::ui);
    if (iVar2 != 0) {
      local_a = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::ui = SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_a);
      __cxa_guard_release(&ConstCastTestT<short>()::ui);
    }
  }
  if (ConstCastTestT<short>()::l == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::l);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<short>();
      ConstCastTestT<short>::l = (long)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<short>()::l);
    }
  }
  if (ConstCastTestT<short>()::ul == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::ul);
    if (iVar2 != 0) {
      local_a = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::ul = SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_a);
      __cxa_guard_release(&ConstCastTestT<short>()::ul);
    }
  }
  if (ConstCastTestT<short>()::ll == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::ll);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<short>();
      ConstCastTestT<short>::ll = (longlong)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<short>()::ll);
    }
  }
  if (ConstCastTestT<short>()::ull == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::ull);
    if (iVar2 != 0) {
      local_a = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::ull = SafeInt::operator_cast_to_unsigned_long_long((SafeInt *)&local_a)
      ;
      __cxa_guard_release(&ConstCastTestT<short>()::ull);
    }
  }
  if (ConstCastTestT<short>()::st == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::st);
    if (iVar2 != 0) {
      local_a = (short)ConstSafeInt<short>();
      ConstCastTestT<short>::st = SafeInt::operator_cast_to_unsigned_long((SafeInt *)&local_a);
      __cxa_guard_release(&ConstCastTestT<short>()::st);
    }
  }
  if (ConstCastTestT<short>()::pt == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::pt);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<short>();
      ConstCastTestT<short>::pt = (ptrdiff_t)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<short>()::pt);
    }
  }
  if (ConstCastTestT<short>()::pl == '\0') {
    iVar2 = __cxa_guard_acquire(&ConstCastTestT<short>()::pl);
    if (iVar2 != 0) {
      SVar1 = ConstSafeInt<short>();
      ConstCastTestT<short>::pl = (int)SVar1.m_int;
      __cxa_guard_release(&ConstCastTestT<short>()::pl);
    }
  }
  return;
}

Assistant:

void ConstCastTestT()
	{
		static const bool b = ConstSafeInt<T>();
		static const wchar_t w = ConstSafeInt<T>();
		static const char c = ConstSafeInt<T>();
		static const signed char sc = ConstSafeInt<T>();
		static const unsigned char uc = ConstSafeInt<T>();
		static const signed short s = ConstSafeInt<T>();
		static const unsigned short us = ConstSafeInt<T>();
		static const signed int i = ConstSafeInt<T>();
		static const unsigned int ui = ConstSafeInt<T>();
		static const signed long l = ConstSafeInt<T>();
		static const unsigned long ul = ConstSafeInt<T>();
		static const signed long long ll = ConstSafeInt<T>();
		static const unsigned long long ull = ConstSafeInt<T>();
		static const size_t st = ConstSafeInt<T>();
		static const ptrdiff_t pt = ConstSafeInt<T>();

		// Also catch the useless unary + operator
		static const int pl = +ConstSafeInt<T>();
	}